

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O2

void __thiscall
ThreeWiseHash<unsigned_int,_unsigned_char>::eat
          (ThreeWiseHash<unsigned_int,_unsigned_char> *this,uchar inchar)

{
  uchar local_9;
  
  local_9 = inchar;
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->ngram,&local_9);
  __updateHashValue(this);
  return;
}

Assistant:

void eat(chartype inchar) {
    ngram.push_back(inchar);
    __updateHashValue();
  }